

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.cpp
# Opt level: O1

string * fs_filesystem_type_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  int iVar1;
  ostream *poVar2;
  string_view fname;
  statfs local_98;
  
  iVar1 = statfs(path._M_str,&local_98);
  if (iVar1 != 0) {
    fname._M_str = "fs_type_linux";
    fname._M_len = 0xd;
    fs_print_error(path,fname);
    goto LAB_0011f04e;
  }
  if (local_98.f_type < 0x58465342) {
    if (local_98.f_type < 0x1021994) {
      if (local_98.f_type == 0x6969) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x73666e;
LAB_0011f340:
        __return_storage_ptr__->_M_string_length = 3;
        return __return_storage_ptr__;
      }
      if (local_98.f_type == 0x9fa0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x636f7270;
        *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 4) = 0x7366;
        __return_storage_ptr__->_M_string_length = 6;
        (__return_storage_ptr__->field_2)._M_local_buf[6] = '\0';
        return __return_storage_ptr__;
      }
      if (local_98.f_type == 0xef53) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x34747865;
        goto LAB_0011f2bc;
      }
    }
    else if (local_98.f_type < 0x15013346) {
      if (local_98.f_type == 0x1021994) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x66706d74;
        goto LAB_0011f204;
      }
      if (local_98.f_type == 0x1021997) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x73663976;
        goto LAB_0011f2bc;
      }
    }
    else {
      if (local_98.f_type == 0x15013346) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x666475;
        goto LAB_0011f340;
      }
      if (local_98.f_type == 0x2011bab0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x61667865;
        *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 4) = 0x74;
        goto LAB_0011f20a;
      }
    }
  }
  else if (local_98.f_type < 0x73717368) {
    if (local_98.f_type < 0x64626720) {
      if (local_98.f_type == 0x58465342) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x736678;
        goto LAB_0011f340;
      }
      if (local_98.f_type == 0x62656572) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x66737973;
LAB_0011f204:
        *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 4) = 0x73;
LAB_0011f20a:
        __return_storage_ptr__->_M_string_length = 5;
        return __return_storage_ptr__;
      }
    }
    else {
      if (local_98.f_type == 0x64626720) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x75626564;
        *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 3) = 0x73666775;
LAB_0011f29d:
        __return_storage_ptr__->_M_string_length = 7;
        (__return_storage_ptr__->field_2)._M_local_buf[7] = '\0';
        return __return_storage_ptr__;
      }
      if (local_98.f_type == 0x65735546) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x65737566;
        goto LAB_0011f2bc;
      }
    }
  }
  else if (local_98.f_type < 0x9123683e) {
    if (local_98.f_type == 0x73717368) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x7366687361757173;
      __return_storage_ptr__->_M_string_length = 8;
      (__return_storage_ptr__->field_2)._M_local_buf[8] = '\0';
      return __return_storage_ptr__;
    }
    if (local_98.f_type == 0x74726163) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      *(undefined4 *)&__return_storage_ptr__->field_2 = 0x63617274;
      *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 3) = 0x73666563;
      goto LAB_0011f29d;
    }
  }
  else {
    if (local_98.f_type == 0xf2f52010) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      *(undefined4 *)&__return_storage_ptr__->field_2 = 0x73663266;
LAB_0011f2bc:
      __return_storage_ptr__->_M_string_length = 4;
      (__return_storage_ptr__->field_2)._M_local_buf[4] = '\0';
      return __return_storage_ptr__;
    }
    if (local_98.f_type == 0x9123683e) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      *(undefined4 *)&__return_storage_ptr__->field_2 = 0x66727462;
      goto LAB_0011f204;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR:fs_filesystem_type ",0x19);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,path._M_str,path._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," unknown type ID: ",0x12);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
LAB_0011f04e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string fs_filesystem_type(std::string_view path)
{
  // return name of filesystem type if known

  std::error_code ec;

#if defined(_WIN32) || defined(__CYGWIN__)

  std::string r(path);

  // Cygwin: assume user input Cygwin path root directly.
  if(!fs_is_cygwin()){

    r = fs_root_name(r);
    if(r.empty())
      return {};

    // GetVolumeInformationA requires a trailing backslash
    r.push_back('\\');
  }

  if(fs_trace) std::cout << "TRACE:filesystem_type(" << path << ") root: " << r << "\n";

  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getvolumeinformationa
  if(std::string name(MAX_PATH+1, '\0');
      GetVolumeInformationA(r.data(), nullptr, 0, nullptr, nullptr, nullptr, name.data(), static_cast<DWORD>(name.size())))
    return fs_trim(name);
#elif defined(__linux__)
# ifdef HAVE_LINUX_MAGIC_H
  return fs_type_linux(path);
# else
  ec = std::make_error_code(std::errc::function_not_supported);
# endif
#elif defined(__APPLE__) || defined(BSD)
  struct statfs s;
  if(!statfs(path.data(), &s))
    return s.f_fstypename;
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}